

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::addViolation
          (ValidStatusCodes *this,
          vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
          *dst,GLenum code,char *description)

{
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var1;
  pointer pRVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *p_Var6;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RuleViolation violation;
  
  pRVar2 = (dst->
           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(dst->
                 super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2) / 0x38;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = uVar3 & 0xffffffff;
  }
  lVar5 = uVar4 + 1;
  p_Var6 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)&pRVar2[-1].rules;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      violation.rules._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &violation.rules._M_t._M_impl.super__Rb_tree_header._M_header;
      violation.rules._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      violation.rules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      violation.rules._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      violation.errorCode = code;
      violation.rules._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           violation.rules._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,description,&local_69);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&violation.rules,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::
      vector<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
      ::push_back(dst,&violation);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&violation.rules._M_t);
      return;
    }
    this_00 = p_Var6 + 0x38;
    p_Var1 = p_Var6 + 0x30;
    p_Var6 = this_00;
  } while (*(GLenum *)p_Var1 != code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&violation,description,(allocator<char> *)&local_68);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&violation
            );
  std::__cxx11::string::~string((string *)&violation);
  return;
}

Assistant:

void ValidStatusCodes::addViolation (std::vector<RuleViolation>& dst, glw::GLenum code, const char* description) const
{
	// rule violation already exists?
	for (int ndx = 0; ndx < (int)dst.size(); ++ndx)
	{
		if (dst[ndx].errorCode == code)
		{
			dst[ndx].rules.insert(std::string(description));
			return;
		}
	}

	// new violation
	{
		RuleViolation violation;

		violation.errorCode = code;
		violation.rules.insert(std::string(description));

		dst.push_back(violation);
	}
}